

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O0

vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> * __thiscall
pstack::Procman::CoreProcess::addressSpace
          (vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
           *__return_storage_ptr__,CoreProcess *this)

{
  bool bVar1;
  element_type *peVar2;
  mapped_type *this_00;
  vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_> *this_01;
  reference pEVar3;
  pointer ppVar4;
  pair<std::_Rb_tree_const_iterator<pstack::Procman::AddressRange::Permission>,_bool> pVar5;
  undefined1 local_2b8 [80];
  set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
  local_268;
  set<pstack::Procman::AddressRange::VmFlag,_std::less<pstack::Procman::AddressRange::VmFlag>,_std::allocator<pstack::Procman::AddressRange::VmFlag>_>
  local_238;
  _Base_ptr local_208;
  undefined1 local_200;
  value_type local_1f4;
  _Base_ptr local_1f0;
  undefined1 local_1e8;
  value_type local_1dc;
  _Base_ptr local_1d8;
  undefined1 local_1d0;
  value_type local_1c4;
  undefined1 local_1c0 [8];
  set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
  flags;
  undefined1 local_188 [8];
  string name;
  iterator ub;
  Elf64_Phdr *hdr;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  ProgramHeaders *__range2_1;
  undefined1 local_138 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
  entry;
  undefined1 local_f8 [7];
  sentinel __end2;
  iterator __begin2;
  FileEntries local_88;
  FileEntries *local_50;
  FileEntries *__range2;
  map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
  entries;
  CoreProcess *this_local;
  vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> *rv;
  
  entries._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
  ::map((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
         *)&__range2);
  peVar2 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->coreImage);
  FileEntries::FileEntries(&local_88,peVar2);
  local_50 = &local_88;
  FileEntries::begin((iterator *)local_f8,local_50);
  FileEntries::end(local_50);
  while (bVar1 = FileEntries::iterator::operator!=
                           ((iterator *)local_f8,(sentinel *)((long)&entry.second.fileOff + 7)),
        bVar1) {
    FileEntries::iterator::operator*[abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
                *)local_138,(iterator *)local_f8);
    this_00 = std::
              map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
              ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                            *)&__range2,(key_type_conflict *)(entry.first.field_2._M_local_buf + 8))
    ;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
    ::operator=(this_00,(type)local_138);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
             *)local_138);
    FileEntries::iterator::operator++((iterator *)local_f8);
  }
  FileEntries::iterator::~iterator((iterator *)local_f8);
  FileEntries::~FileEntries(&local_88);
  std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::vector
            (__return_storage_ptr__);
  peVar2 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->coreImage);
  this_01 = (vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_> *)
            pstack::Elf::Object::getSegments((uint)peVar2);
  __end2_1 = std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::begin(this_01);
  hdr = (Elf64_Phdr *)std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::end(this_01);
  while (bVar1 = __gnu_cxx::
                 operator==<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                           (&__end2_1,
                            (__normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                             *)&hdr), ((bVar1 ^ 0xffU) & 1) != 0) {
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
             ::operator*(&__end2_1);
    name.field_2._8_8_ =
         std::
         map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
         ::upper_bound((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                        *)&__range2,&pEVar3->p_vaddr);
    std::__cxx11::string::string((string *)local_188);
    flags._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                 ::begin((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                          *)&__range2);
    bVar1 = std::operator==((_Self *)((long)&name.field_2 + 8),
                            (_Self *)&flags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>
      ::operator--((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>
                    *)((long)&name.field_2 + 8));
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>
                             *)((long)&name.field_2 + 8));
      if ((pEVar3->p_vaddr <= ppVar4->first) &&
         (ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>
                                 *)((long)&name.field_2 + 8)),
         (ppVar4->second).second.end <= pEVar3->p_vaddr + pEVar3->p_memsz)) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>
                               *)((long)&name.field_2 + 8));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   &(ppVar4->second).first);
      }
    }
    std::
    set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
    ::set((set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
           *)local_1c0);
    if ((pEVar3->p_flags & 2) != 0) {
      local_1c4 = write;
      pVar5 = std::
              set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
              ::insert((set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                        *)local_1c0,&local_1c4);
      local_1d8 = (_Base_ptr)pVar5.first._M_node;
      local_1d0 = pVar5.second;
    }
    if ((pEVar3->p_flags & 4) != 0) {
      local_1dc = read;
      pVar5 = std::
              set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
              ::insert((set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                        *)local_1c0,&local_1dc);
      local_1f0 = (_Base_ptr)pVar5.first._M_node;
      local_1e8 = pVar5.second;
    }
    if ((pEVar3->p_flags & 1) != 0) {
      local_1f4 = exec;
      pVar5 = std::
              set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
              ::insert((set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                        *)local_1c0,&local_1f4);
      local_208 = (_Base_ptr)pVar5.first._M_node;
      local_200 = pVar5.second;
    }
    local_2b8._0_8_ = pEVar3->p_vaddr;
    local_2b8._8_8_ = pEVar3->p_vaddr + pEVar3->p_memsz;
    local_2b8._16_8_ = pEVar3->p_vaddr + pEVar3->p_filesz;
    local_2b8._24_8_ = 0;
    local_2b8._32_4_ = 0;
    local_2b8._36_4_ = 0;
    local_2b8._40_8_ = 0;
    std::__cxx11::string::string
              ((string *)(local_2b8 + 0x30),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    std::
    set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
    ::set(&local_268,
          (set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
           *)local_1c0);
    local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_238._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_238._M_t._M_impl._0_8_ = 0;
    local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_238._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::
    set<pstack::Procman::AddressRange::VmFlag,_std::less<pstack::Procman::AddressRange::VmFlag>,_std::allocator<pstack::Procman::AddressRange::VmFlag>_>
    ::set(&local_238);
    std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
    push_back(__return_storage_ptr__,(value_type *)local_2b8);
    AddressRange::~AddressRange((AddressRange *)local_2b8);
    std::
    set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
    ::~set((set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
            *)local_1c0);
    std::__cxx11::string::~string((string *)local_188);
    __gnu_cxx::
    __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>::
    operator++(&__end2_1);
  }
  std::
  map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
  ::~map((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
          *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AddressRange>
CoreProcess::addressSpace() const {
    // First, go through the NT_FILE note if we have one - that gives us filenames
    std::map<Elf::Off, std::pair<std::string, FileEntry>> entries;
    for (auto entry : FileEntries(*coreImage))
        entries[entry.second.start] = entry;

    // Now go through the PT_LOAD segments in the core to generate the result.
    std::vector<AddressRange> rv;
    for (const auto &hdr : coreImage->getSegments(PT_LOAD)) {
        auto ub = entries.upper_bound(hdr.p_vaddr);
        std::string name;
        if (ub != entries.begin()) {
            --ub;
            if (ub->first >= hdr.p_vaddr && ub->second.second.end <= hdr.p_vaddr + hdr.p_memsz)
                name = ub->second.first;
        }
        std::set<AddressRange::Permission> flags;
        if ((hdr.p_flags & PF_W) != 0)
           flags.insert(AddressRange::Permission::write);
        if ((hdr.p_flags & PF_R) != 0)
           flags.insert(AddressRange::Permission::read);
        if ((hdr.p_flags & PF_X) != 0)
           flags.insert(AddressRange::Permission::exec);
        rv.push_back( { hdr.p_vaddr, hdr.p_vaddr + hdr.p_memsz,
                hdr.p_vaddr + hdr.p_filesz, 0, {0, 0, 0, name}, flags, {}});
    }
    return rv;
}